

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int DLevelScript::CountPlayers(void)

{
  int local_10;
  int local_c;
  int i;
  int count;
  
  local_c = 0;
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    if ((playeringame[local_10] & 1U) != 0) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

int DLevelScript::CountPlayers ()
{
	int count = 0, i;

	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i])
			count++;

	return count;
}